

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

void __thiscall
QTriangulator<unsigned_short>::MonotoneToTriangles::decompose(MonotoneToTriangles *this)

{
  QTriangulator<unsigned_short> *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int count;
  int iVar8;
  long in_FS_OFFSET;
  int right;
  int left;
  int local_7c;
  QDataBuffer<int> local_78;
  QArrayDataPointer<unsigned_short> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (unsigned_short *)0x0;
  local_78.buffer = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDataBuffer<int>::QDataBuffer(&local_78,(this->m_parent->m_indices).d.size);
  this->m_first = 0;
  iVar5 = 0;
  do {
    while( true ) {
      pQVar1 = this->m_parent;
      if ((pQVar1->m_indices).d.size < (long)(iVar5 + 3)) {
        QArrayDataPointer<unsigned_short>::operator=(&(pQVar1->m_indices).d,&local_58);
        QDataBuffer<int>::~QDataBuffer(&local_78);
        QArrayDataPointer<unsigned_short>::~QArrayDataPointer(&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
      uVar7 = 0xffffffffffffffff;
      do {
        lVar6 = uVar7 + 1;
        uVar7 = uVar7 + 1;
      } while ((pQVar1->m_indices).d.ptr[iVar5 + lVar6] != 0xffff);
      this->m_length = (int)uVar7;
      if (2 < uVar7) break;
      iVar5 = iVar5 + (int)uVar7 + 1;
      this->m_first = iVar5;
    }
    local_7c = 0;
    while (bVar2 = less(this,(local_7c + 1) % (int)uVar7,local_7c), bVar2) {
      uVar7 = (ulong)(uint)this->m_length;
      local_7c = (local_7c + 1) % this->m_length;
    }
    iVar5 = this->m_length;
    while (bVar2 = less(this,(local_7c + iVar5 + -1) % iVar5,local_7c), bVar2) {
      iVar5 = this->m_length;
      local_7c = (local_7c + iVar5 + -1) % iVar5;
    }
    local_78.siz = 0;
    QDataBuffer<int>::add(&local_78,&local_7c);
    iVar5 = this->m_length;
    left = (local_7c + iVar5 + -1) % iVar5;
    right = (local_7c + 1) % iVar5;
    bVar2 = leftOfEdge(this,local_7c,left,right);
    bVar3 = less(this,left,right);
    if (!bVar3) {
      QDataBuffer<int>::add(&local_78,&right);
      iVar5 = this->m_length;
      right = (right + 1) % iVar5;
    }
    else {
      QDataBuffer<int>::add(&local_78,&left);
      iVar5 = this->m_length;
      left = (left + iVar5 + -1) % iVar5;
    }
    bVar3 = bVar3;
    for (iVar8 = 0; iVar8 + 2 < iVar5; iVar8 = iVar8 + 1) {
      bVar4 = less(this,left,right);
      if (bVar4) {
        if (bVar3) {
          while ((1 < local_78.siz &&
                 (bVar3 = leftOfEdge(this,left,local_78.buffer[(long)(local_78.siz + -2)],
                                     local_78.buffer[(long)(local_78.siz + -1)]), bVar2 == bVar3)))
          {
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -2)]]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)left]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -1)]]);
            local_78.siz = local_78.siz + -1;
          }
        }
        else {
          for (lVar6 = 1; lVar6 < local_78.siz; lVar6 = lVar6 + 1) {
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[lVar6]]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)left]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[lVar6 + -1]]);
          }
          *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
          QDataBuffer<int>::resize(&local_78,1);
        }
        QDataBuffer<int>::add(&local_78,&left);
        iVar5 = this->m_length;
        left = (left + iVar5 + -1) % iVar5;
        bVar3 = true;
      }
      else {
        if (bVar3) {
          for (lVar6 = 1; lVar6 < local_78.siz; lVar6 = lVar6 + 1) {
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[lVar6 + -1]]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)right]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[lVar6]]);
          }
          *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
          QDataBuffer<int>::resize(&local_78,1);
        }
        else {
          while ((1 < local_78.siz &&
                 (bVar3 = leftOfEdge(this,right,local_78.buffer[(long)(local_78.siz + -1)],
                                     local_78.buffer[(long)(local_78.siz + -2)]), bVar2 == bVar3)))
          {
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -1)]]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)right]);
            QList<unsigned_short>::append
                      ((QList<unsigned_short> *)&local_58,
                       (this->m_parent->m_indices).d.ptr
                       [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -2)]]);
            local_78.siz = local_78.siz + -1;
          }
        }
        QDataBuffer<int>::add(&local_78,&right);
        iVar5 = this->m_length;
        right = (right + 1) % iVar5;
        bVar3 = false;
      }
    }
    iVar5 = this->m_first + iVar5 + 1;
    this->m_first = iVar5;
  } while( true );
}

Assistant:

void QTriangulator<T>::MonotoneToTriangles::decompose()
{
    QList<T> result;
    QDataBuffer<int> stack(m_parent->m_indices.size());
    m_first = 0;
    // Require at least three more indices.
    while (m_first + 3 <= m_parent->m_indices.size()) {
        m_length = 0;
        while (m_parent->m_indices.at(m_first + m_length) != T(-1)) { // Q_TRIANGULATE_END_OF_POLYGON
            ++m_length;
            Q_ASSERT(m_first + m_length < m_parent->m_indices.size());
        }
        if (m_length < 3) {
            m_first += m_length + 1;
            continue;
        }

        int minimum = 0;
        while (less(next(minimum), minimum))
            minimum = next(minimum);
        while (less(previous(minimum), minimum))
            minimum = previous(minimum);

        stack.reset();
        stack.add(minimum);
        int left = previous(minimum);
        int right = next(minimum);
        bool stackIsOnLeftSide;
        bool clockwiseOrder = leftOfEdge(minimum, left, right);

        if (less(left, right)) {
            stack.add(left);
            left = previous(left);
            stackIsOnLeftSide = true;
        } else {
            stack.add(right);
            right = next(right);
            stackIsOnLeftSide = false;
        }

        for (int count = 0; count + 2 < m_length; ++count)
        {
            Q_ASSERT(stack.size() >= 2);
            if (less(left, right)) {
                if (stackIsOnLeftSide == false) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i + 1)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.at(i)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(left, stack.at(stack.size() - 2), stack.last()))) {
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.last()));
                        stack.pop_back();
                    }
                }
                stack.add(left);
                left = previous(left);
                stackIsOnLeftSide = true;
            } else {
                if (stackIsOnLeftSide == true) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i)));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(i + 1)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(right, stack.last(), stack.at(stack.size() - 2)))) {
                        result.push_back(indices(stack.last()));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        stack.pop_back();
                    }
                }
                stack.add(right);
                right = next(right);
                stackIsOnLeftSide = false;
            }
        }

        m_first += m_length + 1;
    }
    m_parent->m_indices = result;
}